

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.cpp
# Opt level: O0

void __thiscall
RewardModelMappingSparseMapped::RewardModelMappingSparseMapped
          (RewardModelMappingSparseMapped *this,size_t nrS,size_t nrJA,string *s_str,string *ja_str)

{
  string *in_RCX;
  size_type in_RDX;
  mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  size_t in_stack_ffffffffffffffb0;
  RewardModel *in_stack_ffffffffffffffc0;
  
  RewardModel::RewardModel(in_stack_ffffffffffffffc0,(size_t)in_RDI,in_stack_ffffffffffffffb0);
  *in_RDI = &PTR_Get_00d35b10;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  std::__cxx11::string::string((string *)(in_RDI + 7));
  boost::numeric::ublas::
  mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  ::mapped_matrix(in_RSI,in_RDX,(size_type)in_RCX,(size_type)in_R8);
  std::__cxx11::string::operator=((string *)(in_RDI + 3),in_RCX);
  std::__cxx11::string::operator=((string *)(in_RDI + 7),in_R8);
  return;
}

Assistant:

RewardModelMappingSparseMapped::RewardModelMappingSparseMapped(size_t nrS, size_t nrJA,
                                                   const string &s_str,
                                                   const string &ja_str) : 
    RewardModel(nrS, nrJA),
    _m_R(nrS,nrJA)
{
    _m_s_str = s_str;
    _m_ja_str = ja_str;
}